

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O2

void testPhiVsSampled(LightHandle *light,SampledWavelengths *lambda)

{
  float fVar1;
  undefined1 auVar2 [16];
  LightLeSample *pLVar3;
  char *pcVar4;
  char *in_R9;
  uint64_t a;
  undefined1 auVar5 [16];
  Float FVar6;
  double dVar7;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  SampledSpectrum SVar10;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  double local_140;
  undefined1 local_138 [16];
  AssertHelper local_110;
  undefined8 local_108;
  AssertHelper local_f0;
  Float local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  optional<pbrt::LightLeSample> ls;
  undefined1 extraout_var [60];
  
  a = 0;
  local_140 = 0.0;
  do {
    if (a == 100000) {
      SVar10 = pbrt::LightHandle::Phi(light,lambda);
      local_108 = local_140 / 100000.0;
      gtest_ar_.success_ = true;
      gtest_ar_._1_7_ = 0x3f847ae147ae14;
      dVar7 = (double)SVar10.values.values[0];
      auVar5._8_8_ = 0x7fffffffffffffff;
      auVar5._0_8_ = 0x7fffffffffffffff;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_108 - dVar7;
      auVar5 = vandpd_avx512vl(auVar9,auVar5);
      gtest_ar._0_8_ = auVar5._0_8_ / dVar7;
      testing::internal::CmpHelperLT<double,double>
                ((internal *)&ls,"std::abs(sum / count - Phi[0]) / Phi[0]","1e-2",
                 (double *)&gtest_ar,(double *)&gtest_ar_);
      if (ls.optionalValue.__data[0] == '\0') {
        testing::Message::Message((Message *)&gtest_ar);
        std::ostream::operator<<((void *)(gtest_ar._0_8_ + 0x10),SVar10.values.values[0]);
        std::operator<<((ostream *)(gtest_ar._0_8_ + 0x10),", sampled ");
        std::ostream::_M_insert<double>(local_108);
        if (ls.optionalValue._8_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)ls.optionalValue._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
                   ,0x7c,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&ls.optionalValue + 8));
      return;
    }
    local_138._0_4_ = pbrt::RadicalInverse(0,a);
    local_138._4_4_ = extraout_XMM0_Db;
    local_138._8_4_ = extraout_XMM0_Dc;
    local_138._12_4_ = extraout_XMM0_Dd;
    FVar6 = pbrt::RadicalInverse(1,a);
    local_108 = (double)CONCAT44(extraout_XMM0_Db_00,FVar6);
    local_e8 = pbrt::RadicalInverse(2,a);
    uStack_e4 = extraout_XMM0_Db_01;
    uStack_e0 = extraout_XMM0_Dc_00;
    uStack_dc = extraout_XMM0_Dd_00;
    auVar8._0_4_ = pbrt::RadicalInverse(3,a);
    auVar8._4_60_ = extraout_var;
    auVar5 = vinsertps_avx(local_138,ZEXT416((uint)local_108),0x10);
    auVar2._4_4_ = uStack_e4;
    auVar2._0_4_ = local_e8;
    auVar2._8_4_ = uStack_e0;
    auVar2._12_4_ = uStack_dc;
    auVar9 = vinsertps_avx(auVar2,auVar8._0_16_,0x10);
    pbrt::LightHandle::SampleLe(&ls,light,(Point2f)auVar5._0_8_,(Point2f)auVar9._0_8_,lambda,0.0);
    if (ls.set != false) {
      pLVar3 = pstd::optional<pbrt::LightLeSample>::value(&ls);
      if ((((pLVar3->ray).o.super_Tuple3<pbrt::Point3,_float>.x != 0.0) ||
          (fVar1 = (pLVar3->ray).o.super_Tuple3<pbrt::Point3,_float>.y, fVar1 != 0.0)) ||
         (NAN(fVar1))) {
        gtest_ar_._0_8_ = (ulong)(uint7)gtest_ar_._1_7_ << 8;
LAB_002ded07:
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::Message::Message((Message *)&local_110);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"ls->ray.o == Point3f(0, 0, 0)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
                   ,0x77,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_110);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        std::__cxx11::string::~string((string *)&gtest_ar);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_110);
      }
      else {
        fVar1 = (pLVar3->ray).o.super_Tuple3<pbrt::Point3,_float>.z;
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        gtest_ar_.success_ = fVar1 == 0.0;
        if ((fVar1 != 0.0) || (NAN(fVar1))) goto LAB_002ded07;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      gtest_ar_._0_4_ = 1;
      pLVar3 = pstd::optional<pbrt::LightLeSample>::value(&ls);
      testing::internal::CmpHelperEQ<int,float>
                ((internal *)&gtest_ar,"1","ls->pdfPos",(int *)&gtest_ar_,&pLVar3->pdfPos);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar4 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
                   ,0x78,pcVar4);
        testing::internal::AssertHelper::operator=(&local_110,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_110);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      pLVar3 = pstd::optional<pbrt::LightLeSample>::value(&ls);
      fVar1 = (pLVar3->L).values.values[0];
      pLVar3 = pstd::optional<pbrt::LightLeSample>::value(&ls);
      local_140 = local_140 + (double)(fVar1 / pLVar3->pdfDir);
    }
    pstd::optional<pbrt::LightLeSample>::~optional(&ls);
    a = a + 1;
  } while( true );
}

Assistant:

static void testPhiVsSampled(LightHandle light, SampledWavelengths &lambda) {
    double sum = 0;
    int count = 100000;
    for (int i = 0; i < count; ++i) {
        Point2f u1{RadicalInverse(0, i), RadicalInverse(1, i)};
        Point2f u2{RadicalInverse(2, i), RadicalInverse(3, i)};
        pstd::optional<LightLeSample> ls = light.SampleLe(u1, u2, lambda, 0 /* time */);
        if (!ls)
            continue;

        EXPECT_TRUE(ls->ray.o == Point3f(0, 0, 0));
        EXPECT_EQ(1, ls->pdfPos);
        sum += ls->L[0] / ls->pdfDir;
    }
    SampledSpectrum Phi = light.Phi(lambda);
    EXPECT_LT(std::abs(sum / count - Phi[0]) / Phi[0], 1e-2)
        << Phi[0] << ", sampled " << sum / count;
}